

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

int __thiscall QMessageBox::open(QMessageBox *this,char *__file,int __oflag,...)

{
  QMessageBoxPrivate *pQVar1;
  char *pcVar2;
  int __oflag_00;
  long in_FS_OFFSET;
  bool bVar3;
  char *signal;
  QMessageBoxPrivate *d;
  QObject *in_stack_ffffffffffffffa8;
  QObject *this_00;
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QMessageBox *)0x7a6784);
  bVar3 = false;
  if (___oflag != (char *)0x0) {
    pcVar2 = strchr(___oflag,0x2a);
    bVar3 = pcVar2 != (char *)0x0;
  }
  pcVar2 = "2finished(int)";
  if (bVar3) {
    pcVar2 = "2buttonClicked(QAbstractButton*)";
  }
  this_00 = local_10;
  QObject::connect(this_00,(char *)this,(QObject *)pcVar2,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  QByteArray::operator=(&pQVar1->signalToDisconnectOnClose,pcVar2);
  QPointer<QObject>::operator=((QPointer<QObject> *)this_00,in_stack_ffffffffffffffa8);
  QByteArray::operator=(&pQVar1->memberToDisconnectOnClose,___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::open(QObject *receiver, const char *member)
{
    Q_D(QMessageBox);
    const char *signal = member && strchr(member, '*') ? SIGNAL(buttonClicked(QAbstractButton*))
                                                       : SIGNAL(finished(int));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}